

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O0

void extract_min_heap(U32Pair *min_heap,u32 last_index)

{
  uint uVar1;
  uint uVar2;
  uint local_24;
  u32 min_index;
  u32 right_index;
  u32 left_index;
  u32 index;
  u32 last_index_local;
  U32Pair *min_heap_local;
  
  *min_heap = min_heap[last_index];
  right_index = 0;
  while( true ) {
    if (last_index <= right_index * 2 + 1) {
      return;
    }
    uVar1 = right_index * 2 + 1;
    uVar2 = right_index * 2 + 2;
    local_24 = right_index;
    if ((uVar1 < last_index) && (min_heap[uVar1].count < min_heap[right_index].count)) {
      local_24 = uVar1;
    }
    if ((uVar2 < last_index) && (min_heap[uVar2].count < min_heap[local_24].count)) {
      local_24 = uVar2;
    }
    if (local_24 == right_index) break;
    swap_pair(min_heap + local_24,min_heap + right_index);
    right_index = local_24;
  }
  return;
}

Assistant:

void extract_min_heap(U32Pair* min_heap, u32 last_index) {
  min_heap[0] = min_heap[last_index];
  u32 index = 0;
  while (index * 2 + 1 < last_index) {
    u32 left_index = index * 2 + 1, right_index = index * 2 + 2;
    u32 min_index = index;
    if (left_index < last_index &&
        min_heap[min_index].count > min_heap[left_index].count) {
      min_index = left_index;
    }
    if (right_index < last_index &&
        min_heap[min_index].count > min_heap[right_index].count) {
      min_index = right_index;
    }
    if (min_index == index) {
      break;
    }
    swap_pair(&min_heap[min_index], &min_heap[index]);
    index = min_index;
  }
}